

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::makeI32x4Const
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,array<unsigned_int,_4UL> *vals)

{
  const_reference pvVar1;
  reference this_00;
  Literal local_100;
  Result<wasm::Ok> local_e8;
  Literal local_b0;
  ulong local_98;
  size_t i;
  array<wasm::Literal,_4UL> lanes;
  array<unsigned_int,_4UL> *vals_local;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDefsCtx *this_local;
  
  lanes._M_elems[3].type.id = (uintptr_t)vals;
  std::array<wasm::Literal,_4UL>::array((array<wasm::Literal,_4UL> *)&i);
  for (local_98 = 0; local_98 < 4; local_98 = local_98 + 1) {
    pvVar1 = std::array<unsigned_int,_4UL>::operator[]
                       ((array<unsigned_int,_4UL> *)lanes._M_elems[3].type.id,local_98);
    wasm::Literal::Literal(&local_b0,*pvVar1);
    this_00 = std::array<wasm::Literal,_4UL>::operator[]((array<wasm::Literal,_4UL> *)&i,local_98);
    wasm::Literal::operator=(this_00,&local_b0);
    wasm::Literal::~Literal(&local_b0);
  }
  wasm::Literal::Literal(&local_100,(LaneArray<4> *)&i);
  IRBuilder::makeConst(&local_e8,&this->irBuilder,&local_100);
  withLoc<wasm::Ok>(__return_storage_ptr__,this,pos,&local_e8);
  Result<wasm::Ok>::~Result(&local_e8);
  wasm::Literal::~Literal(&local_100);
  std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)&i);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeI32x4Const(Index pos,
                          const std::vector<Annotation>& annotations,
                          const std::array<uint32_t, 4>& vals) {
    std::array<Literal, 4> lanes;
    for (size_t i = 0; i < 4; ++i) {
      lanes[i] = Literal(vals[i]);
    }
    return withLoc(pos, irBuilder.makeConst(Literal(lanes)));
  }